

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ze_nullddi.cpp
# Opt level: O3

ze_result_t
driver::zeCommandQueueGetOrdinal(ze_command_queue_handle_t hCommandQueue,uint32_t *pOrdinal)

{
  ze_result_t zVar1;
  
  if (DAT_0010e2d8 != (code *)0x0) {
    zVar1 = (*DAT_0010e2d8)();
    return zVar1;
  }
  return ZE_RESULT_SUCCESS;
}

Assistant:

__zedlllocal ze_result_t ZE_APICALL
    zeCommandQueueGetOrdinal(
        ze_command_queue_handle_t hCommandQueue,        ///< [in] handle of the command queue
        uint32_t* pOrdinal                              ///< [out] command queue group ordinal
        )
    {
        ze_result_t result = ZE_RESULT_SUCCESS;

        // if the driver has created a custom function, then call it instead of using the generic path
        auto pfnGetOrdinal = context.zeDdiTable.CommandQueue.pfnGetOrdinal;
        if( nullptr != pfnGetOrdinal )
        {
            result = pfnGetOrdinal( hCommandQueue, pOrdinal );
        }
        else
        {
            // generic implementation
        }

        return result;
    }